

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderDesc.cpp
# Opt level: O2

Expected<renderdesc::Command::Index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* __thiscall
renderdesc::Loader::getTextureIndex
          (Expected<renderdesc::Command::Index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,Loader *this,string *s)

{
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var1;
  string local_58;
  char *local_38;
  size_type local_30;
  char local_28 [8];
  undefined8 uStack_20;
  
  _Var1 = std::
          __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                    ((this->names_).texture.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     (this->names_).texture.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
  if (_Var1._M_current ==
      (this->names_).texture.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    format_abi_cxx11_(&local_58,"Unknown texture %s",(s->_M_dataplus)._M_p);
    local_38 = local_28;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p == &local_58.field_2) {
      uStack_20 = local_58.field_2._8_8_;
    }
    else {
      local_38 = local_58._M_dataplus._M_p;
    }
    local_30 = local_58._M_string_length;
    local_58._M_string_length = 0;
    local_58.field_2._M_local_buf[0] = '\0';
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    Expected<renderdesc::Command::Index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::Expected(__return_storage_ptr__,(UnexpectedType *)&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::__cxx11::string::~string((string *)&local_58);
  }
  else {
    (__return_storage_ptr__->field_0).value_ =
         *(Index *)((long)&((this->indexes_).texture.
                            super__Vector_base<renderdesc::Command::Index,_std::allocator<renderdesc::Command::Index>_>
                            ._M_impl.super__Vector_impl_data._M_start)->index +
                   ((long)_Var1._M_current -
                    (long)(this->names_).texture.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 2));
    __return_storage_ptr__->has_value_ = true;
  }
  return __return_storage_ptr__;
}

Assistant:

Expected<Command::Index, std::string> getTextureIndex(const std::string &s) {
		const auto it = std::find(names_.texture.begin(), names_.texture.end(), s);
		if (it == names_.texture.end())
			return Unexpected(format("Unknown texture %s", s.c_str()));

		return indexes_.texture[it - names_.texture.begin()];
	}